

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void cleanup_body(void)

{
  player_body *ppVar1;
  player_body *p;
  ulong uVar2;
  long lVar3;
  
  p = bodies;
  if (bodies != (player_body *)0x0) {
    do {
      ppVar1 = p->next;
      string_free(p->name);
      if (p->count != 0) {
        lVar3 = 0x10;
        uVar2 = 0;
        do {
          string_free(*(char **)((long)&p->slots->next + lVar3));
          uVar2 = uVar2 + 1;
          lVar3 = lVar3 + 0x20;
        } while (uVar2 < p->count);
      }
      mem_free(p->slots);
      mem_free(p);
      p = ppVar1;
    } while (ppVar1 != (player_body *)0x0);
  }
  return;
}

Assistant:

static void cleanup_body(void)
{
	struct player_body *b = bodies;
	struct player_body *next;
	int i;

	while (b) {
		next = b->next;
		string_free((char *)b->name);
		for (i = 0; i < b->count; i++)
			string_free((char *)b->slots[i].name);
		mem_free(b->slots);
		mem_free(b);
		b = next;
	}
}